

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O1

dsa_key_material_t * crypto_malloc_dsa(DSA *dsa)

{
  int iVar1;
  int iVar2;
  dsa_key_material_t *keyMat;
  uchar *to;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  BIGNUM *bn_g;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_priv_key;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  if ((dsa != (DSA *)0x0) &&
     (keyMat = (dsa_key_material_t *)malloc(0x50), keyMat != (dsa_key_material_t *)0x0)) {
    local_38 = (BIGNUM *)0x0;
    local_40 = (BIGNUM *)0x0;
    local_48 = (BIGNUM *)0x0;
    local_50 = (BIGNUM *)0x0;
    DSA_get0_pqg(dsa,&local_38,&local_40);
    DSA_get0_key(dsa,&local_50,&local_48);
    iVar1 = BN_num_bits(local_38);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)keyMat = (long)(iVar2 >> 3);
    iVar1 = BN_num_bits(local_40);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)(keyMat + 8) = (long)(iVar2 >> 3);
    iVar1 = BN_num_bits((BIGNUM *)0x0);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)(keyMat + 0x10) = (long)(iVar2 >> 3);
    iVar1 = BN_num_bits(local_48);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)(keyMat + 0x18) = (long)(iVar2 >> 3);
    iVar1 = BN_num_bits(local_50);
    iVar2 = iVar1 + 0xe;
    if (-1 < iVar1 + 7) {
      iVar2 = iVar1 + 7;
    }
    *(long *)(keyMat + 0x20) = (long)(iVar2 >> 3);
    to = (uchar *)malloc(*(size_t *)keyMat);
    *(uchar **)(keyMat + 0x28) = to;
    pvVar3 = malloc(*(size_t *)(keyMat + 8));
    *(void **)(keyMat + 0x30) = pvVar3;
    pvVar4 = malloc(*(size_t *)(keyMat + 0x10));
    *(void **)(keyMat + 0x38) = pvVar4;
    pvVar5 = malloc(*(size_t *)(keyMat + 0x18));
    *(void **)(keyMat + 0x40) = pvVar5;
    pvVar6 = malloc((long)(iVar2 >> 3));
    *(void **)(keyMat + 0x48) = pvVar6;
    if (((pvVar4 != (void *)0x0 && (pvVar3 != (void *)0x0 && to != (uchar *)0x0)) &&
        (pvVar5 != (void *)0x0)) && (pvVar6 != (void *)0x0)) {
      BN_bn2bin(local_38,to);
      BN_bn2bin(local_40,*(uchar **)(keyMat + 0x30));
      BN_bn2bin((BIGNUM *)0x0,*(uchar **)(keyMat + 0x38));
      BN_bn2bin(local_48,*(uchar **)(keyMat + 0x40));
      BN_bn2bin(local_50,*(uchar **)(keyMat + 0x48));
      return keyMat;
    }
    crypto_free_dsa(keyMat);
  }
  return (dsa_key_material_t *)0x0;
}

Assistant:

dsa_key_material_t* crypto_malloc_dsa(DSA* dsa)
{
	if (dsa == NULL)
	{
		return NULL;
	}

	dsa_key_material_t* keyMat = (dsa_key_material_t*)malloc(sizeof(dsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_priv_key = NULL;
	const BIGNUM* bn_pub_key = NULL;
	DSA_get0_pqg(dsa, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(dsa, &bn_pub_key, &bn_priv_key);

	keyMat->sizeP = BN_num_bytes(bn_p);
	keyMat->sizeQ = BN_num_bytes(bn_q);
	keyMat->sizeG = BN_num_bytes(bn_g);
	keyMat->sizeX = BN_num_bytes(bn_priv_key);
	keyMat->sizeY = BN_num_bytes(bn_pub_key);

	keyMat->bigP = (CK_VOID_PTR)malloc(keyMat->sizeP);
	keyMat->bigQ = (CK_VOID_PTR)malloc(keyMat->sizeQ);
	keyMat->bigG = (CK_VOID_PTR)malloc(keyMat->sizeG);
	keyMat->bigX = (CK_VOID_PTR)malloc(keyMat->sizeX);
	keyMat->bigY = (CK_VOID_PTR)malloc(keyMat->sizeY);

	if (!keyMat->bigP || !keyMat->bigQ || !keyMat->bigG || !keyMat->bigX || !keyMat->bigY)
	{
		crypto_free_dsa(keyMat);
		return NULL;
	}

	BN_bn2bin(bn_p, (unsigned char*)keyMat->bigP);
	BN_bn2bin(bn_q, (unsigned char*)keyMat->bigQ);
	BN_bn2bin(bn_g, (unsigned char*)keyMat->bigG);
	BN_bn2bin(bn_priv_key, (unsigned char*)keyMat->bigX);
	BN_bn2bin(bn_pub_key, (unsigned char*)keyMat->bigY);

	return keyMat;
}